

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O1

void __thiscall display::test_method(display *this)

{
  string *psVar1;
  long *plVar2;
  output_test_stream output;
  undefined1 local_230 [16];
  shared_count local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  undefined **local_1b8;
  undefined1 local_1b0;
  undefined8 *local_1a8;
  char **local_1a0;
  long *local_198 [2];
  long local_188 [46];
  
  psVar1 = (string *)dynamicgraph::PoolStorage::getInstance();
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"my-entity","");
  plVar2 = (long *)dynamicgraph::PoolStorage::getEntity(psVar1);
  if (local_198[0] != local_188) {
    operator_delete(local_198[0],local_188[0] + 1);
  }
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream
            ((output_test_stream *)local_198,&local_1c8,1,1);
  (**(code **)(*plVar2 + 0x30))(plVar2,(output_test_stream *)local_198);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/entity.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0xb1);
  local_1f8 = "CustomEntity: my-entity";
  local_1f0 = "";
  boost::test_tools::output_test_stream::is_equal(local_230,local_198,&local_1f8,1);
  local_1a0 = &local_208;
  local_208 = "output.is_equal(\"CustomEntity: my-entity\")";
  local_200 = "";
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00133bd8;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/entity.cpp"
  ;
  local_210 = "";
  boost::test_tools::tt_detail::report_assertion(local_230,&local_1b8,&local_218,0xb1,1,0,0);
  boost::detail::shared_count::~shared_count(&local_220);
  boost::test_tools::output_test_stream::~output_test_stream((output_test_stream *)local_198);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(display) {
  dynamicgraph::Entity &entity =
      dynamicgraph::PoolStorage::getInstance()->getEntity("my-entity");

  output_test_stream output;

  entity.display(output);
  BOOST_CHECK(output.is_equal("CustomEntity: my-entity"));
}